

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void * multi_thread_client_shutdown(void *args)

{
  fdb_status fVar1;
  undefined1 auStackY_2d8 [16];
  void *pvStackY_2c8;
  undefined8 uStackY_2c0;
  fdb_file_handle *in_stack_fffffffffffffd48;
  undefined1 local_298 [248];
  undefined1 *local_1a0;
  void **thread_ret;
  pthread_t *tid;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_status status;
  fdb_file_handle *tdbfile;
  int nclients;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  void *args_local;
  
  uStackY_2c0 = 0x10fc1c;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  if (args == (void *)0x0) {
    uStackY_2c0 = 0x10fc3c;
    memleak_start();
    uStackY_2c0 = 0x10fc48;
    system("rm -rf  dummy* > errorlog.txt");
    thread_ret = &pvStackY_2c8;
    local_1a0 = auStackY_2d8;
    for (nclients = 0; nclients < 2; nclients = nclients + 1) {
      pthread_create((pthread_t *)(thread_ret + nclients),(pthread_attr_t *)0x0,
                     multi_thread_client_shutdown,&nclients);
    }
    for (nclients = 0; nclients < 2; nclients = nclients + 1) {
      pthread_join((pthread_t)thread_ret[nclients],(void **)(local_1a0 + (long)nclients * 8));
    }
    memleak_end();
    if (multi_thread_client_shutdown::__test_pass == 0) {
      fprintf(_stderr,"%s FAILED\n","multi thread client shutdown");
    }
    else {
      fprintf(_stderr,"%s PASSED\n","multi thread client shutdown");
    }
    return (void *)0x0;
  }
  uStackY_2c0 = 0x10fd73;
  fdb_get_default_config();
  uStackY_2c0 = 0x10fd8b;
  memcpy(&kvs_config.custom_cmp_param,local_298,0xf8);
  uStackY_2c0 = 0x10fd97;
  fdb_get_default_kvs_config();
  uStackY_2c0 = 0x10fdea;
  fVar1 = fdb_open((fdb_file_handle **)fconfig._232_8_,(char *)fconfig.log_msg_level,
                   (fdb_config *)fconfig.breakpad_minidump_dir);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    uStackY_2c0 = 0x10fe17;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x7dc);
    multi_thread_client_shutdown::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      uStackY_2c0 = 0x10fe48;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x7dc,"void *multi_thread_client_shutdown(void *)");
    }
  }
  uStackY_2c0 = 0x10fe53;
  fVar1 = fdb_close(in_stack_fffffffffffffd48);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    uStackY_2c0 = 0x10fe7c;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x7dd);
    multi_thread_client_shutdown::__test_pass = 0;
    uStackY_2c0 = 0x10fe8f;
    fVar1 = fdb_close(in_stack_fffffffffffffd48);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      uStackY_2c0 = 0x10feb5;
      __assert_fail("fdb_close(tdbfile) == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x7dd,"void *multi_thread_client_shutdown(void *)");
    }
  }
  uStackY_2c0 = 0x10febc;
  fdb_shutdown();
  uStackY_2c0 = 0x10fec5;
  pthread_exit((void *)0x0);
}

Assistant:

void *multi_thread_client_shutdown(void *args)
{

    TEST_INIT();

    int i, r;
    int nclients;
    fdb_file_handle *tdbfile;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    thread_t *tid;
    void **thread_ret;

    if (args == NULL)
    { // parent
        memleak_start();

        r = system(SHELL_DEL" dummy* > errorlog.txt");
        (void)r;
        nclients = 2;
        tid = alca(thread_t, nclients);
        thread_ret = alca(void *, nclients);
        for (i=0;i<nclients;++i){
            thread_create(&tid[i], multi_thread_client_shutdown, (void *)&i);
        }
        for (i=0;i<nclients;++i){
            thread_join(tid[i], &thread_ret[i]);
        }

        memleak_end();
        TEST_RESULT("multi thread client shutdown");
        return NULL;
    }

    // threads enter here //

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.compaction_threshold = 0;

    // open/close db
    status = fdb_open(&tdbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CHK(fdb_close(tdbfile) == FDB_RESULT_SUCCESS);

    // shutdown
    fdb_shutdown();
    thread_exit(0);
    return NULL;
}